

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_GammaCorrection(GammaCorrectionForm2 GammaCorrection)

{
  bool bVar1;
  uint uVar2;
  uint8_t value;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_30;
  
  Unit_Test::intensityArray(&intensity,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_30,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&input,&intensity,&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_30);
  uVar2 = rand();
  dVar3 = (double)(uVar2 % 100) / 100.0;
  uVar2 = rand();
  dVar5 = (double)(uVar2 % 300) / 100.0;
  (*GammaCorrection)(input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,dVar3,dVar5);
  dVar5 = pow((double)*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start / 255.0,dVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar5 * dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,ZEXT816(0x406fe00000000000),ZEXT816(0x3fe0000000000000));
  value = 0xff;
  if (auVar4._0_8_ < 256.0) {
    value = (uint8_t)(int)auVar4._0_8_;
  }
  bVar1 = Unit_Test::verifyImage
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,value);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form2_GammaCorrection(GammaCorrectionForm2 GammaCorrection)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const double a     = randomValue <uint32_t>( 100 ) / 100.0;
        const double gamma = randomValue <uint32_t>( 300 ) / 100.0;

        GammaCorrection( input[0], input[1], a, gamma );

        const double value = a * pow( intensity[0] / 255.0, gamma ) * 255 + 0.5;
        const uint8_t corrected = (value < 256) ? static_cast<uint8_t>(value) : 255;

        return verifyImage( input[1], corrected );
    }